

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

vector<RPCResult,_std::allocator<RPCResult>_> * wallet::TransactionDescriptionString(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffe758;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffe75c;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffe768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe770;
  allocator_type *in_stack_ffffffffffffe790;
  allocator<char> *in_stack_ffffffffffffe798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe7a0;
  undefined7 in_stack_ffffffffffffe7a8;
  undefined1 in_stack_ffffffffffffe7af;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffe7b0;
  undefined7 in_stack_ffffffffffffe7b8;
  undefined1 in_stack_ffffffffffffe7bf;
  undefined7 in_stack_ffffffffffffe7c0;
  undefined1 in_stack_ffffffffffffe7c7;
  string *in_stack_ffffffffffffe7c8;
  undefined4 in_stack_ffffffffffffe7d0;
  Type in_stack_ffffffffffffe7d4;
  undefined4 in_stack_ffffffffffffe7d8;
  Type in_stack_ffffffffffffe7dc;
  RPCResult *in_stack_ffffffffffffe7e0;
  undefined1 *local_17e0;
  undefined1 *local_17c8;
  undefined1 *local_17b0;
  long *local_1798;
  allocator<char> local_143a;
  allocator<char> local_1439 [31];
  allocator<char> local_141a;
  allocator<char> local_1419;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  allocator<char> local_13fa;
  allocator<char> local_13f9;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  allocator<char> local_13da;
  allocator<char> local_13d9;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  allocator<char> local_13b9;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  allocator<char> local_1399;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  allocator<char> local_137b;
  allocator<char> local_137a [2];
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  allocator<char> local_135a;
  allocator<char> local_1359 [31];
  allocator<char> local_133a;
  allocator<char> local_1339;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  allocator<char> local_131a;
  allocator<char> local_1319;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  allocator<char> local_12fb;
  allocator<char> local_12fa [2];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  allocator<char> local_12da;
  allocator<char> local_12d9 [31];
  allocator<char> local_12ba;
  allocator<char> local_12b9;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  allocator<char> local_129a;
  allocator<char> local_1299;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  allocator<char> local_127a;
  allocator<char> local_1279;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  allocator<char> local_1259;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  allocator<char> local_123a;
  allocator<char> local_1239;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  allocator<char> local_121a;
  allocator<char> local_1219;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  allocator<char> local_11fa;
  allocator<char> local_11f9;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  allocator<char> local_11da;
  allocator<char> local_11d9;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  allocator<char> local_11ba;
  allocator<char> local_11b9;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  allocator<char> local_119a;
  allocator<char> local_1199 [65];
  undefined1 local_1158 [136];
  undefined1 local_10d0 [208];
  undefined8 local_1000;
  undefined1 local_ed0 [136];
  undefined1 local_e48 [256];
  undefined1 local_d48 [136];
  undefined1 local_cc0 [672];
  long local_a20 [323];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_11b8 = 0;
  uStack_11b0 = 0;
  local_11a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,in_stack_ffffffffffffe758));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_11d8 = 0;
  uStack_11d0 = 0;
  local_11c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,in_stack_ffffffffffffe758));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_11f8 = 0;
  uStack_11f0 = 0;
  local_11e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1218 = 0;
  uStack_1210 = 0;
  local_1208 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1238 = 0;
  uStack_1230 = 0;
  local_1228 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1258 = 0;
  uStack_1250 = 0;
  local_1248 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
                 in_stack_ffffffffffffe7a0);
  std::operator+(in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
  local_1278 = 0;
  uStack_1270 = 0;
  local_1268 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1298 = 0;
  uStack_1290 = 0;
  local_1288 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_12b8 = 0;
  uStack_12b0 = 0;
  local_12a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_12f8 = 0;
  uStack_12f0 = 0;
  local_12e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  __l._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l,
             in_stack_ffffffffffffe790);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1318 = 0;
  uStack_1310 = 0;
  local_1308 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1338 = 0;
  uStack_1330 = 0;
  local_1328 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1378 = 0;
  uStack_1370 = 0;
  local_1368 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_00,
             in_stack_ffffffffffffe790);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1398 = 0;
  uStack_1390 = 0;
  local_1388 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
                 in_stack_ffffffffffffe7a0);
  std::operator+(in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
  local_13b8 = 0;
  uStack_13b0 = 0;
  local_13a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
                 in_stack_ffffffffffffe7a0);
  std::operator+(in_stack_ffffffffffffe770,(char *)in_stack_ffffffffffffe768);
  local_13d8 = 0;
  uStack_13d0 = 0;
  local_13c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_13f8 = 0;
  uStack_13f0 = 0;
  local_13e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_1418 = 0;
  uStack_1410 = 0;
  local_1408 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe7af,in_stack_ffffffffffffe7a8),
             (char *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7dc,
             (string *)CONCAT44(in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7d0),
             in_stack_ffffffffffffe7c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe7c7,in_stack_ffffffffffffe7c0),
             (bool)in_stack_ffffffffffffe7bf);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_01,
             in_stack_ffffffffffffe790);
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe7dc,in_stack_ffffffffffffe7d8),
             in_stack_ffffffffffffe7d4,in_stack_ffffffffffffe7c8,(bool)in_stack_ffffffffffffe7c7,
             (string *)CONCAT17(in_stack_ffffffffffffe7bf,in_stack_ffffffffffffe7b8),
             in_stack_ffffffffffffe7b0,(bool)in_stack_ffffffffffffe7af);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe7a8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe7a0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe7af;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe798,__l_02,
             in_stack_ffffffffffffe790);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  local_1798 = &local_8;
  do {
    local_1798 = local_1798 + -0x11;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  } while (local_1798 != local_a20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  local_17b0 = local_10d0;
  do {
    local_17b0 = local_17b0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  } while (local_17b0 != local_1158);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_143a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(local_1439);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_141a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1419);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_13fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_13f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_13da);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_13d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_13b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1399);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_137b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(local_137a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  local_17c8 = local_e48;
  do {
    local_17c8 = local_17c8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  } while (local_17c8 != local_ed0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_135a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(local_1359);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_133a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1339);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_131a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1319);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_12fb);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(local_12fa);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  local_17e0 = local_cc0;
  do {
    local_17e0 = local_17e0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  } while (local_17e0 != local_d48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_12da);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(local_12d9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_12ba);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_12b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_129a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1299);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_127a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1279);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1259);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_123a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1239);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_121a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_1219);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_11fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_11f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_11da);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_11d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_11ba);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_11b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe768);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(&local_119a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe75c,uVar1));
  std::allocator<char>::~allocator(local_1199);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> TransactionDescriptionString()
{
    return{{RPCResult::Type::NUM, "confirmations", "The number of confirmations for the transaction. Negative confirmations means the\n"
               "transaction conflicted that many blocks ago."},
           {RPCResult::Type::BOOL, "generated", /*optional=*/true, "Only present if the transaction's only input is a coinbase one."},
           {RPCResult::Type::BOOL, "trusted", /*optional=*/true, "Whether we consider the transaction to be trusted and safe to spend from.\n"
                "Only present when the transaction has 0 confirmations (or negative confirmations, if conflicted)."},
           {RPCResult::Type::STR_HEX, "blockhash", /*optional=*/true, "The block hash containing the transaction."},
           {RPCResult::Type::NUM, "blockheight", /*optional=*/true, "The block height containing the transaction."},
           {RPCResult::Type::NUM, "blockindex", /*optional=*/true, "The index of the transaction in the block that includes it."},
           {RPCResult::Type::NUM_TIME, "blocktime", /*optional=*/true, "The block time expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           {RPCResult::Type::STR_HEX, "wtxid", "The hash of serialized transaction, including witness data."},
           {RPCResult::Type::ARR, "walletconflicts", "Confirmed transactions that have been detected by the wallet to conflict with this transaction.",
           {
               {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           }},
           {RPCResult::Type::STR_HEX, "replaced_by_txid", /*optional=*/true, "Only if 'category' is 'send'. The txid if this tx was replaced."},
           {RPCResult::Type::STR_HEX, "replaces_txid", /*optional=*/true, "Only if 'category' is 'send'. The txid if this tx replaces another."},
           {RPCResult::Type::ARR, "mempoolconflicts", "Transactions in the mempool that directly conflict with either this transaction or an ancestor transaction",
           {
               {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
           }},
           {RPCResult::Type::STR, "to", /*optional=*/true, "If a comment to is associated with the transaction."},
           {RPCResult::Type::NUM_TIME, "time", "The transaction time expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::NUM_TIME, "timereceived", "The time received expressed in " + UNIX_EPOCH_TIME + "."},
           {RPCResult::Type::STR, "comment", /*optional=*/true, "If a comment is associated with the transaction, only present if not empty."},
           {RPCResult::Type::STR, "bip125-replaceable", "(\"yes|no|unknown\") Whether this transaction signals BIP125 replaceability or has an unconfirmed ancestor signaling BIP125 replaceability.\n"
               "May be unknown for unconfirmed transactions not in the mempool because their unconfirmed ancestors are unknown."},
           {RPCResult::Type::ARR, "parent_descs", /*optional=*/true, "Only if 'category' is 'received'. List of parent descriptors for the output script of this coin.", {
               {RPCResult::Type::STR, "desc", "The descriptor string."},
           }},
           };
}